

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool __thiscall ClipperLib::Clipper::FixupIntersectionOrder(Clipper *this)

{
  pointer ppIVar1;
  IntersectNode *pIVar2;
  ulong uVar3;
  IntersectNode *__tmp;
  TEdge *pTVar4;
  TEdge *pTVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  
  CopyAELToSEL(this);
  std::
  __sort<__gnu_cxx::__normal_iterator<ClipperLib::IntersectNode**,std::vector<ClipperLib::IntersectNode*,std::allocator<ClipperLib::IntersectNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ClipperLib::IntersectNode*,ClipperLib::IntersectNode*)>>
            ((__normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
              )(this->m_IntersectList).
               super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
              )(this->m_IntersectList).
               super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(ClipperLib::IntersectNode_*,_ClipperLib::IntersectNode_*)>)
             0x27d66c);
  uVar8 = (long)(this->m_IntersectList).
                super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_IntersectList).
                super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar7 = 1;
  for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    ppIVar1 = (this->m_IntersectList).
              super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar2 = ppIVar1[uVar9];
    pTVar5 = pIVar2->Edge1;
    pTVar4 = pIVar2->Edge2;
    if ((pTVar5->NextInSEL != pTVar4) && (uVar3 = uVar7, pTVar5->PrevInSEL != pTVar4)) {
      do {
        uVar6 = uVar3;
        if (uVar8 <= uVar6) goto LAB_0027d597;
        pTVar5 = ppIVar1[uVar6]->Edge1;
        pTVar4 = ppIVar1[uVar6]->Edge2;
      } while ((pTVar5->NextInSEL != pTVar4) && (uVar3 = uVar6 + 1, pTVar5->PrevInSEL != pTVar4));
      if (uVar8 == uVar6) break;
      ppIVar1[uVar9] = ppIVar1[uVar6];
      ppIVar1[uVar6] = pIVar2;
      pIVar2 = (this->m_IntersectList).
               super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9];
      pTVar5 = pIVar2->Edge1;
      pTVar4 = pIVar2->Edge2;
    }
    SwapPositionsInSEL(this,pTVar5,pTVar4);
    uVar7 = uVar7 + 1;
  }
LAB_0027d597:
  return uVar8 <= uVar9;
}

Assistant:

bool Clipper::FixupIntersectionOrder()
{
  //pre-condition: intersections are sorted Bottom-most first.
  //Now it's crucial that intersections are made only between adjacent edges,
  //so to ensure this the order of intersections may need adjusting ...
  CopyAELToSEL();
  std::sort(m_IntersectList.begin(), m_IntersectList.end(), IntersectListSort);
  size_t cnt = m_IntersectList.size();
  for (size_t i = 0; i < cnt; ++i) 
  {
    if (!EdgesAdjacent(*m_IntersectList[i]))
    {
      size_t j = i + 1;
      while (j < cnt && !EdgesAdjacent(*m_IntersectList[j])) j++;
      if (j == cnt)  return false;
      std::swap(m_IntersectList[i], m_IntersectList[j]);
    }
    SwapPositionsInSEL(m_IntersectList[i]->Edge1, m_IntersectList[i]->Edge2);
  }
  return true;
}